

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O0

VarBranch FlatZinc::ann2ivarsel(Node *ann)

{
  bool bVar1;
  char *__rhs;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Atom *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pbVar3 = in_RDI;
  if (in_RDI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __rhs = (char *)0x0;
  }
  else {
    __rhs = (char *)__dynamic_cast(in_RDI,&AST::Node::typeinfo,&AST::Atom::typeinfo,0);
  }
  if (__rhs != (char *)0x0) {
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_INORDER;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_SIZE_MIN;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_SIZE_MAX;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_MIN_MIN;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_MAX_MIN;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_MAX_MAX;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_MIN_MAX;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_DEGREE_MAX;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_SIZE_MIN;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_REGRET_MIN_MAX;
    }
    bVar1 = std::operator==(pbVar3,__rhs);
    if (bVar1) {
      return VAR_RANDOM;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "% Warning: Unknown or not support variable selection annotation \'");
  (**(code **)(*(long *)in_RDI + 0x10))(in_RDI,&std::cerr);
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "\'! Ignore variable selection annotation and replace it by \'input_order\'."
                          );
  std::operator<<(poVar2,'\n');
  return VAR_INORDER;
}

Assistant:

VarBranch ann2ivarsel(AST::Node* ann) {
	if (auto* s = dynamic_cast<AST::Atom*>(ann)) {
		if (s->id == "input_order") {
			return VAR_INORDER;
		}
		if (s->id == "first_fail") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "anti_first_fail") {
			return VAR_SIZE_MAX;
		}
		if (s->id == "smallest") {
			return VAR_MIN_MIN;
		}
		if (s->id == "smallest_largest") {
			return VAR_MAX_MIN;
		}
		if (s->id == "largest") {
			return VAR_MAX_MAX;
		}
		if (s->id == "largest_smallest") {
			return VAR_MIN_MAX;
		}
		if (s->id == "occurrence") {
			return VAR_DEGREE_MAX;
		}
		if (s->id == "most_constrained") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "max_regret") {
			return VAR_REGRET_MIN_MAX;
		}
		if (s->id == "random_order") {
			return VAR_RANDOM;
		}
#ifdef HAS_VAR_IMPACT
		if (s->id == "impact") return VAR_IMPACT;
#endif
	}
	std::cerr << "% Warning: Unknown or not support variable selection annotation '";
	ann->print(std::cerr);
	std::cerr << "'! Ignore variable selection annotation and replace it by 'input_order'." << '\n';
	return VAR_INORDER;
}